

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::GenerateTemplateForSingleString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *descriptor,
          StringPiece field_member)

{
  StringPiece str;
  StringPiece value;
  StringPiece str_00;
  FieldOptions_CType FVar1;
  ulong uVar2;
  FieldOptions *this_00;
  AlphaNum *b;
  FieldDescriptor *field;
  AlphaNum local_348;
  AlphaNum local_318;
  SubstituteArg local_2e8;
  SubstituteArg local_2b8;
  SubstituteArg local_288;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  SubstituteArg local_1c8;
  SubstituteArg local_198;
  string local_168;
  SubstituteArg local_148;
  FieldDescriptor *local_118;
  char *pcStack_110;
  SubstituteArg local_100;
  allocator local_b9;
  string local_b8;
  FieldDescriptor *local_98;
  char *local_90;
  AlphaNum local_88;
  AlphaNum local_58;
  _anonymous_namespace_ *local_28;
  FieldDescriptor *descriptor_local;
  StringPiece field_member_local;
  
  b = (AlphaNum *)field_member.ptr_;
  local_28 = this;
  descriptor_local = descriptor;
  field_member_local.ptr_ = (char *)b;
  field_member_local.length_ = (size_type)__return_storage_ptr__;
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = FieldDescriptor::options((FieldDescriptor *)local_28);
    FVar1 = FieldOptions::ctype(this_00);
    if (FVar1 == FieldOptions_CType_STRING) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,"$0.IsDefault(nullptr) ? &$1.get() : $0.GetPointer()",&local_b9
                );
      local_118 = descriptor_local;
      pcStack_110 = field_member_local.ptr_;
      value.length_ = (size_type)field_member_local.ptr_;
      value.ptr_ = (char *)descriptor_local;
      strings::internal::SubstituteArg::SubstituteArg(&local_100,value);
      MakeDefaultName_abi_cxx11_(&local_168,(cpp *)local_28,field);
      strings::internal::SubstituteArg::SubstituteArg(&local_148,&local_168);
      strings::internal::SubstituteArg::SubstituteArg(&local_198);
      strings::internal::SubstituteArg::SubstituteArg(&local_1c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_228);
      strings::internal::SubstituteArg::SubstituteArg(&local_258);
      strings::internal::SubstituteArg::SubstituteArg(&local_288);
      strings::internal::SubstituteArg::SubstituteArg(&local_2b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_2e8);
      strings::Substitute(__return_storage_ptr__,&local_b8,&local_100,&local_148,&local_198,
                          &local_1c8,&local_1f8,&local_228,&local_258,&local_288,&local_2b8,
                          &local_2e8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    else {
      strings::AlphaNum::AlphaNum(&local_318,"&");
      str.length_ = (size_type)field_member_local.ptr_;
      str.ptr_ = (char *)descriptor_local;
      strings::AlphaNum::AlphaNum(&local_348,str);
      StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_318,&local_348,b);
    }
  }
  else {
    strings::AlphaNum::AlphaNum(&local_58,"&");
    local_98 = descriptor_local;
    local_90 = field_member_local.ptr_;
    str_00.length_ = (size_type)field_member_local.ptr_;
    str_00.ptr_ = (char *)descriptor_local;
    strings::AlphaNum::AlphaNum(&local_88,str_00);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_58,&local_88,b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateTemplateForSingleString(const FieldDescriptor* descriptor,
                                            StringPiece field_member) {
  if (descriptor->default_value_string().empty()) {
    return StrCat("&", field_member);
  }

  if (descriptor->options().ctype() == google::protobuf::FieldOptions::STRING) {
    return strings::Substitute(
        "$0.IsDefault(nullptr) ? &$1.get() : $0.GetPointer()", field_member,
        MakeDefaultName(descriptor));
  }

  return StrCat("&", field_member);
}